

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

void __thiscall
QCommandLineParserPrivate::~QCommandLineParserPrivate(QCommandLineParserPrivate *this)

{
  QHash<long_long,_QList<QString>_> *in_RDI;
  
  QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::~QList
            ((QList<QCommandLineParserPrivate::PositionalArgumentDefinition> *)0x1f9243);
  QString::~QString((QString *)0x1f9254);
  QList<QString>::~QList((QList<QString> *)0x1f9262);
  QList<QString>::~QList((QList<QString> *)0x1f9270);
  QList<QString>::~QList((QList<QString> *)0x1f927e);
  QHash<long_long,_QList<QString>_>::~QHash(in_RDI);
  QHash<QString,_long_long>::~QHash((QHash<QString,_long_long> *)in_RDI);
  QList<QCommandLineOption>::~QList((QList<QCommandLineOption> *)0x1f92a8);
  QString::~QString((QString *)0x1f92b2);
  return;
}

Assistant:

inline QCommandLineParserPrivate()
        : singleDashWordOptionMode(QCommandLineParser::ParseAsCompactedShortOptions),
          optionsAfterPositionalArgumentsMode(QCommandLineParser::ParseAsOptions),
          builtinVersionOption(false),
          builtinHelpOption(false),
          needsParsing(true)
    { }